

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O2

void CoreML::Specification::CoreMLModels::protobuf_VisionFeaturePrint_2eproto::TableStruct::Shutdown
               (void)

{
  if (DAT_003527d0 == '\x01') {
    DAT_003527d0 = '\0';
    (*(code *)*_VisionFeaturePrint_Scene_default_instance_)();
  }
  if (DAT_00352808 == '\x01') {
    DAT_00352808 = '\0';
    (*(code *)*_VisionFeaturePrint_Objects_default_instance_)();
  }
  if (DAT_00352830 == '\x01') {
    DAT_00352830 = 0;
    (*(code *)*_VisionFeaturePrint_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _VisionFeaturePrint_Scene_default_instance_.Shutdown();
  _VisionFeaturePrint_Objects_default_instance_.Shutdown();
  _VisionFeaturePrint_default_instance_.Shutdown();
}